

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O2

bool vkt::tessellation::anon_unknown_0::TessCoordComponent::compareOneMinusTessCoord
               (TestLog *log,float value)

{
  ostringstream *this;
  MessageBuilder local_190;
  
  if ((value != 1.0) || (NAN(value))) {
    this = &local_190.m_str;
    local_190.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::operator<<((ostream *)this,
                    "Failure: comp + (1.0-comp) doesn\'t equal 1.0 for some component of tessellation coordinate"
                   );
    tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  }
  return (bool)(-(value == 1.0) & 1);
}

Assistant:

bool compareOneMinusTessCoord (tcu::TestLog& log, const float value)
{
	if (value != 1.0f)
	{
		log << tcu::TestLog::Message << "Failure: comp + (1.0-comp) doesn't equal 1.0 for some component of tessellation coordinate" << tcu::TestLog::EndMessage;
		return false;
	}
	return true;
}